

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_vector_quantity.cpp
# Opt level: O2

void __thiscall
polyscope::SurfaceVertexTangentVectorQuantity::buildVertexInfoGUI
          (SurfaceVertexTangentVectorQuantity *this,size_t iV)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [64];
  vec2 vec;
  stringstream buffer;
  vec2 local_1c0;
  char *local_1b8 [4];
  stringstream local_198 [16];
  ostream local_188 [376];
  undefined1 extraout_var [56];
  
  ImGui::TextUnformatted(*(char **)&(this->super_SurfaceVectorQuantity).field_0x148,(char *)0x0);
  ImGui::NextColumn();
  auVar2._0_8_ = render::ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_>::getValue
                           (&(this->
                             super_TangentVectorQuantity<polyscope::SurfaceVertexTangentVectorQuantity>
                             ).tangentVectors,iV);
  auVar2._8_56_ = extraout_var;
  local_1c0 = (vec2)vmovlps_avx(auVar2._0_16_);
  std::__cxx11::stringstream::stringstream(local_198);
  operator<<(local_188,&local_1c0);
  std::__cxx11::stringbuf::str();
  ImGui::TextUnformatted(local_1b8[0],(char *)0x0);
  std::__cxx11::string::~string((string *)local_1b8);
  ImGui::NextColumn();
  ImGui::NextColumn();
  auVar1._0_4_ = local_1c0.field_0.x * local_1c0.field_0.x;
  auVar1._4_4_ = local_1c0.field_1.y * local_1c0.field_1.y;
  auVar1._8_8_ = 0;
  auVar1 = vhaddps_avx(auVar1,auVar1);
  auVar1 = vsqrtss_avx(auVar1,auVar1);
  ImGui::Text("magnitude: %g",(double)auVar1._0_4_);
  ImGui::NextColumn();
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

void SurfaceVertexTangentVectorQuantity::buildVertexInfoGUI(size_t iV) {
  ImGui::TextUnformatted(name.c_str());
  ImGui::NextColumn();

  glm::vec2 vec = tangentVectors.getValue(iV);

  std::stringstream buffer;
  buffer << vec;
  ImGui::TextUnformatted(buffer.str().c_str());

  ImGui::NextColumn();
  ImGui::NextColumn();
  ImGui::Text("magnitude: %g", glm::length(vec));
  ImGui::NextColumn();
}